

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_cli.c
# Opt level: O0

void run_alcOpenDevice(CallerInfo *callerinfo,ALCdevice *retval,ALCchar *devicename,
                      ALint major_version,ALint minor_version,ALCchar *devspec,ALCchar *extensions)

{
  ALCdevice *local_38;
  ALCdevice *dev;
  ALCchar *devspec_local;
  ALint minor_version_local;
  ALint major_version_local;
  ALCchar *devicename_local;
  ALCdevice *retval_local;
  CallerInfo *callerinfo_local;
  
  local_38 = (*REAL_alcOpenDevice)(devicename);
  if (((local_38 == (ALCdevice *)0x0) && (retval != (ALCdevice *)0x0)) &&
     (fprintf(_stderr,"Uhoh, failed to open playback device when original run did!\n"),
     devicename != (ALCchar *)0x0)) {
    fprintf(_stderr,"Trying NULL device...\n");
    local_38 = (*REAL_alcOpenDevice)((ALCchar *)0x0);
    if (local_38 == (ALCdevice *)0x0) {
      fprintf(_stderr,"Still no luck. This is probably going to go wrong.\n");
    }
    else {
      fprintf(_stderr,"That worked. Carrying on.\n");
    }
  }
  if (local_38 != (ALCdevice *)0x0) {
    add_device_to_map(retval,local_38);
  }
  return;
}

Assistant:

static void run_alcOpenDevice(CallerInfo *callerinfo, ALCdevice *retval, const ALCchar *devicename, ALint major_version, ALint minor_version, const ALCchar *devspec, const ALCchar *extensions)
{
    ALCdevice *dev = REAL_alcOpenDevice(devicename);
    if (!dev && retval) {
        fprintf(stderr, "Uhoh, failed to open playback device when original run did!\n");
        if (devicename) {
            fprintf(stderr, "Trying NULL device...\n");
            dev = REAL_alcOpenDevice(NULL);
            if (!dev) {
                fprintf(stderr, "Still no luck. This is probably going to go wrong.\n");
            } else {
                fprintf(stderr, "That worked. Carrying on.\n");
            }
        }
    }
    if (dev) {
        add_device_to_map(retval, dev);
    }
}